

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_6a8;
  int *local_6a0;
  long *local_688;
  void *local_660;
  int *local_658;
  undefined8 local_650;
  undefined4 local_648;
  long *local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined8 local_620;
  void *local_618;
  int *local_610;
  undefined8 local_608;
  undefined4 local_600;
  long *local_5f8;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined8 local_5d8;
  void *local_5d0;
  int *local_5c8;
  undefined8 local_5c0;
  undefined4 local_5b8;
  long *local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined8 local_590;
  void *local_588;
  int *local_580;
  undefined8 local_578;
  undefined4 local_570;
  long *local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  void *local_540;
  int *local_538;
  undefined8 local_530;
  undefined4 local_528;
  long *local_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined8 local_500;
  void *local_4f8;
  int *local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  long *local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined8 local_4b8;
  void *local_4a0;
  int *local_498;
  undefined8 local_490;
  undefined4 local_488;
  long *local_480;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined8 local_460;
  long *local_458;
  int local_444;
  void **local_440;
  void **local_430;
  void **local_420;
  void **local_410;
  void **local_400;
  void **local_3f0;
  void **local_3e0;
  void **local_3d0;
  int local_3c0;
  undefined4 local_3bc;
  void **local_3b8;
  void **local_3b0;
  void **local_3a8;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  void **local_390;
  void **local_388;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  void **local_370;
  void **local_368;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  void **local_350;
  void **local_348;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  void **local_330;
  void **local_328;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  void **local_310;
  void **local_308;
  int local_300;
  undefined4 local_2fc;
  void **local_2f8;
  void **local_2f0;
  void **local_2e8;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  void **local_2d0;
  void **local_2c8;
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  long *local_2a0;
  long *local_298;
  long *local_290;
  long *local_288;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  int local_260;
  undefined4 local_25c;
  void **local_258;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  int local_240;
  undefined4 local_23c;
  void **local_238;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_458 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_4a0,in_RSI,*(undefined4 *)(in_RDI + 0xd8),0);
  ppvVar2 = (void **)(in_RDI + 0xe0);
  local_2d8 = &local_4a0;
  local_2d0 = ppvVar2;
  if (ppvVar2 != local_2d8) {
    if (local_498 != (int *)0x0) {
      local_2dc = 1;
      LOCK();
      local_2e0 = *local_498;
      *local_498 = *local_498 + 1;
      UNLOCK();
    }
    local_278 = ppvVar2;
    if (*(long *)(in_RDI + 0xe8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe8);
      local_27c = 0xffffffff;
      LOCK();
      local_280 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_280 == 1) {
        if (*(long *)(in_RDI + 0x100) == 0) {
          local_48 = *ppvVar2;
          if (local_48 != (void *)0x0) {
            free(local_48);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    *ppvVar2 = *local_2d8;
    *(void **)(in_RDI + 0xe8) = local_2d8[1];
    *(void **)(in_RDI + 0xf0) = local_2d8[2];
    *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(local_2d8 + 3);
    *(void **)(in_RDI + 0x100) = local_2d8[4];
    *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_2d8 + 5);
    *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_2d8 + 0x2c);
    *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_2d8 + 6);
    *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_2d8 + 0x34);
    *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_2d8 + 7);
    *(void **)(in_RDI + 0x120) = local_2d8[8];
  }
  local_440 = &local_4a0;
  local_2c8 = ppvVar2;
  local_108 = local_440;
  if (local_498 != (int *)0x0) {
    local_10c = 0xffffffff;
    LOCK();
    local_110 = *local_498;
    *local_498 = *local_498 + -1;
    UNLOCK();
    if (local_110 == 1) {
      if (local_480 == (long *)0x0) {
        if (local_4a0 != (void *)0x0) {
          free(local_4a0);
        }
      }
      else {
        (**(code **)(*local_480 + 0x18))(local_480,local_4a0);
      }
    }
  }
  local_4a0 = (void *)0x0;
  local_490 = 0;
  local_488 = 0;
  local_478 = 0;
  local_474 = 0;
  local_470 = 0;
  local_46c = 0;
  local_468 = 0;
  local_460 = 0;
  local_498 = (int *)0x0;
  local_288 = (long *)(in_RDI + 0xe0);
  bVar3 = true;
  if (*local_288 != 0) {
    bVar3 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
    local_40 = local_288;
  }
  if (bVar3) {
    local_444 = -100;
  }
  else {
    (**(code **)(*local_458 + 0x10))(&local_4f8,local_458,*(undefined4 *)(in_RDI + 0xd0),1);
    ppvVar2 = (void **)(in_RDI + 0x128);
    local_2f8 = &local_4f8;
    local_2f0 = ppvVar2;
    if (ppvVar2 != local_2f8) {
      if (local_4f0 != (int *)0x0) {
        local_2fc = 1;
        LOCK();
        local_300 = *local_4f0;
        *local_4f0 = *local_4f0 + 1;
        UNLOCK();
      }
      local_268 = ppvVar2;
      if (*(long *)(in_RDI + 0x130) != 0) {
        piVar1 = *(int **)(in_RDI + 0x130);
        local_26c = 0xffffffff;
        LOCK();
        local_270 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_270 == 1) {
          if (*(long *)(in_RDI + 0x148) == 0) {
            local_50 = *ppvVar2;
            if (local_50 != (void *)0x0) {
              free(local_50);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x138) = 0;
      *(undefined4 *)(in_RDI + 0x140) = 0;
      *(undefined4 *)(in_RDI + 0x150) = 0;
      *(undefined4 *)(in_RDI + 0x154) = 0;
      *(undefined4 *)(in_RDI + 0x158) = 0;
      *(undefined4 *)(in_RDI + 0x15c) = 0;
      *(undefined4 *)(in_RDI + 0x160) = 0;
      *(undefined8 *)(in_RDI + 0x168) = 0;
      *(undefined8 *)(in_RDI + 0x130) = 0;
      *ppvVar2 = *local_2f8;
      *(void **)(in_RDI + 0x130) = local_2f8[1];
      *(void **)(in_RDI + 0x138) = local_2f8[2];
      *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_2f8 + 3);
      *(void **)(in_RDI + 0x148) = local_2f8[4];
      *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_2f8 + 5);
      *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_2f8 + 0x2c);
      *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_2f8 + 6);
      *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_2f8 + 0x34);
      *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_2f8 + 7);
      *(void **)(in_RDI + 0x168) = local_2f8[8];
    }
    local_430 = &local_4f8;
    local_2e8 = ppvVar2;
    local_128 = local_430;
    if (local_4f0 != (int *)0x0) {
      local_12c = 0xffffffff;
      LOCK();
      local_130 = *local_4f0;
      *local_4f0 = *local_4f0 + -1;
      UNLOCK();
      if (local_130 == 1) {
        if (local_4d8 == (long *)0x0) {
          if (local_4f8 != (void *)0x0) {
            free(local_4f8);
          }
        }
        else {
          (**(code **)(*local_4d8 + 0x18))(local_4d8,local_4f8);
        }
      }
    }
    local_4f8 = (void *)0x0;
    local_4e8 = 0;
    local_4e0 = 0;
    local_4d0 = 0;
    local_4cc = 0;
    local_4c8 = 0;
    local_4c4 = 0;
    local_4c0 = 0;
    local_4b8 = 0;
    local_4f0 = (int *)0x0;
    local_290 = (long *)(in_RDI + 0x128);
    bVar3 = true;
    if (*local_290 != 0) {
      bVar3 = *(long *)(in_RDI + 0x168) * (long)*(int *)(in_RDI + 0x160) == 0;
      local_38 = local_290;
    }
    if (bVar3) {
      local_444 = -100;
    }
    else {
      (**(code **)(*local_458 + 0x10))(&local_540,local_458,*(undefined4 *)(in_RDI + 0xd8),0);
      ppvVar2 = (void **)(in_RDI + 0x170);
      local_318 = &local_540;
      local_310 = ppvVar2;
      if (ppvVar2 != local_318) {
        if (local_538 != (int *)0x0) {
          local_31c = 1;
          LOCK();
          local_320 = *local_538;
          *local_538 = *local_538 + 1;
          UNLOCK();
        }
        local_258 = ppvVar2;
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_25c = 0xffffffff;
          LOCK();
          local_260 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_260 == 1) {
            if (*(long *)(in_RDI + 400) == 0) {
              local_58 = *ppvVar2;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*ppvVar2);
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
        *ppvVar2 = *local_318;
        *(void **)(in_RDI + 0x178) = local_318[1];
        *(void **)(in_RDI + 0x180) = local_318[2];
        *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_318 + 3);
        *(void **)(in_RDI + 400) = local_318[4];
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_318 + 5);
        *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_318 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_318 + 6);
        *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_318 + 0x34);
        *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_318 + 7);
        *(void **)(in_RDI + 0x1b0) = local_318[8];
      }
      local_420 = &local_540;
      local_308 = ppvVar2;
      local_148 = local_420;
      if (local_538 != (int *)0x0) {
        local_14c = 0xffffffff;
        LOCK();
        local_150 = *local_538;
        *local_538 = *local_538 + -1;
        UNLOCK();
        if (local_150 == 1) {
          if (local_520 == (long *)0x0) {
            if (local_540 != (void *)0x0) {
              free(local_540);
            }
          }
          else {
            (**(code **)(*local_520 + 0x18))(local_520,local_540);
          }
        }
      }
      local_540 = (void *)0x0;
      local_530 = 0;
      local_528 = 0;
      local_518 = 0;
      local_514 = 0;
      local_510 = 0;
      local_50c = 0;
      local_508 = 0;
      local_500 = 0;
      local_538 = (int *)0x0;
      local_298 = (long *)(in_RDI + 0x170);
      bVar3 = true;
      if (*local_298 != 0) {
        bVar3 = *(long *)(in_RDI + 0x1b0) * (long)*(int *)(in_RDI + 0x1a8) == 0;
        local_30 = local_298;
      }
      if (bVar3) {
        local_444 = -100;
      }
      else {
        (**(code **)(*local_458 + 0x10))(&local_588,local_458,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1b8);
        local_338 = &local_588;
        local_330 = ppvVar2;
        if (ppvVar2 != local_338) {
          if (local_580 != (int *)0x0) {
            local_33c = 1;
            LOCK();
            local_340 = *local_580;
            *local_580 = *local_580 + 1;
            UNLOCK();
          }
          local_248 = ppvVar2;
          if (*(long *)(in_RDI + 0x1c0) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1c0);
            local_24c = 0xffffffff;
            LOCK();
            local_250 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_250 == 1) {
              if (*(long *)(in_RDI + 0x1d8) == 0) {
                local_60 = *ppvVar2;
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1d8) + 0x18))
                          (*(long **)(in_RDI + 0x1d8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1c8) = 0;
          *(undefined4 *)(in_RDI + 0x1d0) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1e4) = 0;
          *(undefined4 *)(in_RDI + 0x1e8) = 0;
          *(undefined4 *)(in_RDI + 0x1ec) = 0;
          *(undefined4 *)(in_RDI + 0x1f0) = 0;
          *(undefined8 *)(in_RDI + 0x1f8) = 0;
          *(undefined8 *)(in_RDI + 0x1c0) = 0;
          *ppvVar2 = *local_338;
          *(void **)(in_RDI + 0x1c0) = local_338[1];
          *(void **)(in_RDI + 0x1c8) = local_338[2];
          *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_338 + 3);
          *(void **)(in_RDI + 0x1d8) = local_338[4];
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_338 + 5);
          *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_338 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_338 + 6);
          *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_338 + 0x34);
          *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_338 + 7);
          *(void **)(in_RDI + 0x1f8) = local_338[8];
        }
        local_410 = &local_588;
        local_328 = ppvVar2;
        local_168 = local_410;
        if (local_580 != (int *)0x0) {
          local_16c = 0xffffffff;
          LOCK();
          local_170 = *local_580;
          *local_580 = *local_580 + -1;
          UNLOCK();
          if (local_170 == 1) {
            if (local_568 == (long *)0x0) {
              if (local_588 != (void *)0x0) {
                free(local_588);
              }
            }
            else {
              (**(code **)(*local_568 + 0x18))(local_568,local_588);
            }
          }
        }
        local_588 = (void *)0x0;
        local_578 = 0;
        local_570 = 0;
        local_560 = 0;
        local_55c = 0;
        local_558 = 0;
        local_554 = 0;
        local_550 = 0;
        local_548 = 0;
        local_580 = (int *)0x0;
        local_2a0 = (long *)(in_RDI + 0x1b8);
        bVar3 = true;
        if (*local_2a0 != 0) {
          bVar3 = *(long *)(in_RDI + 0x1f8) * (long)*(int *)(in_RDI + 0x1f0) == 0;
          local_28 = local_2a0;
        }
        if (bVar3) {
          local_444 = -100;
        }
        else {
          (**(code **)(*local_458 + 0x10))(&local_5d0,local_458,*(undefined4 *)(in_RDI + 0xd8),0);
          ppvVar2 = (void **)(in_RDI + 0x200);
          local_358 = &local_5d0;
          local_350 = ppvVar2;
          if (ppvVar2 != local_358) {
            if (local_5c8 != (int *)0x0) {
              local_35c = 1;
              LOCK();
              local_360 = *local_5c8;
              *local_5c8 = *local_5c8 + 1;
              UNLOCK();
            }
            local_238 = ppvVar2;
            if (*(long *)(in_RDI + 0x208) != 0) {
              piVar1 = *(int **)(in_RDI + 0x208);
              local_23c = 0xffffffff;
              LOCK();
              local_240 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_240 == 1) {
                if (*(long *)(in_RDI + 0x220) == 0) {
                  local_68 = *ppvVar2;
                  if (local_68 != (void *)0x0) {
                    free(local_68);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x220) + 0x18))
                            (*(long **)(in_RDI + 0x220),*ppvVar2);
                }
              }
            }
            *ppvVar2 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x210) = 0;
            *(undefined4 *)(in_RDI + 0x218) = 0;
            *(undefined4 *)(in_RDI + 0x228) = 0;
            *(undefined4 *)(in_RDI + 0x22c) = 0;
            *(undefined4 *)(in_RDI + 0x230) = 0;
            *(undefined4 *)(in_RDI + 0x234) = 0;
            *(undefined4 *)(in_RDI + 0x238) = 0;
            *(undefined8 *)(in_RDI + 0x240) = 0;
            *(undefined8 *)(in_RDI + 0x208) = 0;
            *ppvVar2 = *local_358;
            *(void **)(in_RDI + 0x208) = local_358[1];
            *(void **)(in_RDI + 0x210) = local_358[2];
            *(undefined4 *)(in_RDI + 0x218) = *(undefined4 *)(local_358 + 3);
            *(void **)(in_RDI + 0x220) = local_358[4];
            *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_358 + 5);
            *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_358 + 0x2c);
            *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_358 + 6);
            *(undefined4 *)(in_RDI + 0x234) = *(undefined4 *)((long)local_358 + 0x34);
            *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_358 + 7);
            *(void **)(in_RDI + 0x240) = local_358[8];
          }
          local_400 = &local_5d0;
          local_348 = ppvVar2;
          local_188 = local_400;
          if (local_5c8 != (int *)0x0) {
            local_18c = 0xffffffff;
            LOCK();
            local_190 = *local_5c8;
            *local_5c8 = *local_5c8 + -1;
            UNLOCK();
            if (local_190 == 1) {
              if (local_5b0 == (long *)0x0) {
                if (local_5d0 != (void *)0x0) {
                  free(local_5d0);
                }
              }
              else {
                (**(code **)(*local_5b0 + 0x18))(local_5b0,local_5d0);
              }
            }
          }
          local_5d0 = (void *)0x0;
          local_5c0 = 0;
          local_5b8 = 0;
          local_5a8 = 0;
          local_5a4 = 0;
          local_5a0 = 0;
          local_59c = 0;
          local_598 = 0;
          local_590 = 0;
          local_5c8 = (int *)0x0;
          local_2a8 = (long *)(in_RDI + 0x200);
          bVar3 = true;
          if (*local_2a8 != 0) {
            bVar3 = *(long *)(in_RDI + 0x240) * (long)*(int *)(in_RDI + 0x238) == 0;
            local_20 = local_2a8;
          }
          if (bVar3) {
            local_444 = -100;
          }
          else {
            (**(code **)(*local_458 + 0x10))(&local_618,local_458,*(undefined4 *)(in_RDI + 0xd0),1);
            ppvVar2 = (void **)(in_RDI + 0x248);
            local_378 = &local_618;
            local_370 = ppvVar2;
            if (ppvVar2 != local_378) {
              if (local_610 != (int *)0x0) {
                local_37c = 1;
                LOCK();
                local_380 = *local_610;
                *local_610 = *local_610 + 1;
                UNLOCK();
              }
              local_228 = ppvVar2;
              if (*(long *)(in_RDI + 0x250) != 0) {
                piVar1 = *(int **)(in_RDI + 0x250);
                local_22c = 0xffffffff;
                LOCK();
                local_230 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_230 == 1) {
                  if (*(long *)(in_RDI + 0x268) == 0) {
                    local_70 = *ppvVar2;
                    if (local_70 != (void *)0x0) {
                      free(local_70);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x268) + 0x18))
                              (*(long **)(in_RDI + 0x268),*ppvVar2);
                  }
                }
              }
              *ppvVar2 = (void *)0x0;
              *(undefined8 *)(in_RDI + 600) = 0;
              *(undefined4 *)(in_RDI + 0x260) = 0;
              *(undefined4 *)(in_RDI + 0x270) = 0;
              *(undefined4 *)(in_RDI + 0x274) = 0;
              *(undefined4 *)(in_RDI + 0x278) = 0;
              *(undefined4 *)(in_RDI + 0x27c) = 0;
              *(undefined4 *)(in_RDI + 0x280) = 0;
              *(undefined8 *)(in_RDI + 0x288) = 0;
              *(undefined8 *)(in_RDI + 0x250) = 0;
              *ppvVar2 = *local_378;
              *(void **)(in_RDI + 0x250) = local_378[1];
              *(void **)(in_RDI + 600) = local_378[2];
              *(undefined4 *)(in_RDI + 0x260) = *(undefined4 *)(local_378 + 3);
              *(void **)(in_RDI + 0x268) = local_378[4];
              *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_378 + 5);
              *(undefined4 *)(in_RDI + 0x274) = *(undefined4 *)((long)local_378 + 0x2c);
              *(undefined4 *)(in_RDI + 0x278) = *(undefined4 *)(local_378 + 6);
              *(undefined4 *)(in_RDI + 0x27c) = *(undefined4 *)((long)local_378 + 0x34);
              *(undefined4 *)(in_RDI + 0x280) = *(undefined4 *)(local_378 + 7);
              *(void **)(in_RDI + 0x288) = local_378[8];
            }
            local_3f0 = &local_618;
            local_368 = ppvVar2;
            local_1a8 = local_3f0;
            if (local_610 != (int *)0x0) {
              local_1ac = 0xffffffff;
              LOCK();
              local_1b0 = *local_610;
              *local_610 = *local_610 + -1;
              UNLOCK();
              if (local_1b0 == 1) {
                if (local_5f8 == (long *)0x0) {
                  if (local_618 != (void *)0x0) {
                    free(local_618);
                  }
                }
                else {
                  (**(code **)(*local_5f8 + 0x18))(local_5f8,local_618);
                }
              }
            }
            local_618 = (void *)0x0;
            local_608 = 0;
            local_600 = 0;
            local_5f0 = 0;
            local_5ec = 0;
            local_5e8 = 0;
            local_5e4 = 0;
            local_5e0 = 0;
            local_5d8 = 0;
            local_610 = (int *)0x0;
            local_2b0 = (long *)(in_RDI + 0x248);
            bVar3 = true;
            if (*local_2b0 != 0) {
              bVar3 = *(long *)(in_RDI + 0x288) * (long)*(int *)(in_RDI + 0x280) == 0;
              local_18 = local_2b0;
            }
            if (bVar3) {
              local_444 = -100;
            }
            else {
              (**(code **)(*local_458 + 0x10))
                        (&local_660,local_458,*(undefined4 *)(in_RDI + 0xd8),0);
              ppvVar2 = (void **)(in_RDI + 0x290);
              local_398 = &local_660;
              local_390 = ppvVar2;
              if (ppvVar2 != local_398) {
                if (local_658 != (int *)0x0) {
                  local_39c = 1;
                  LOCK();
                  local_3a0 = *local_658;
                  *local_658 = *local_658 + 1;
                  UNLOCK();
                }
                local_218 = ppvVar2;
                if (*(long *)(in_RDI + 0x298) != 0) {
                  piVar1 = *(int **)(in_RDI + 0x298);
                  local_21c = 0xffffffff;
                  LOCK();
                  local_220 = *piVar1;
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (local_220 == 1) {
                    if (*(long *)(in_RDI + 0x2b0) == 0) {
                      local_78 = *ppvVar2;
                      if (local_78 != (void *)0x0) {
                        free(local_78);
                      }
                    }
                    else {
                      (**(code **)(**(long **)(in_RDI + 0x2b0) + 0x18))
                                (*(long **)(in_RDI + 0x2b0),*ppvVar2);
                    }
                  }
                }
                *ppvVar2 = (void *)0x0;
                *(undefined8 *)(in_RDI + 0x2a0) = 0;
                *(undefined4 *)(in_RDI + 0x2a8) = 0;
                *(undefined4 *)(in_RDI + 0x2b8) = 0;
                *(undefined4 *)(in_RDI + 700) = 0;
                *(undefined4 *)(in_RDI + 0x2c0) = 0;
                *(undefined4 *)(in_RDI + 0x2c4) = 0;
                *(undefined4 *)(in_RDI + 0x2c8) = 0;
                *(undefined8 *)(in_RDI + 0x2d0) = 0;
                *(undefined8 *)(in_RDI + 0x298) = 0;
                *ppvVar2 = *local_398;
                *(void **)(in_RDI + 0x298) = local_398[1];
                *(void **)(in_RDI + 0x2a0) = local_398[2];
                *(undefined4 *)(in_RDI + 0x2a8) = *(undefined4 *)(local_398 + 3);
                *(void **)(in_RDI + 0x2b0) = local_398[4];
                *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_398 + 5);
                *(undefined4 *)(in_RDI + 700) = *(undefined4 *)((long)local_398 + 0x2c);
                *(undefined4 *)(in_RDI + 0x2c0) = *(undefined4 *)(local_398 + 6);
                *(undefined4 *)(in_RDI + 0x2c4) = *(undefined4 *)((long)local_398 + 0x34);
                *(undefined4 *)(in_RDI + 0x2c8) = *(undefined4 *)(local_398 + 7);
                *(void **)(in_RDI + 0x2d0) = local_398[8];
              }
              local_3e0 = &local_660;
              local_388 = ppvVar2;
              local_1c8 = local_3e0;
              if (local_658 != (int *)0x0) {
                local_1cc = 0xffffffff;
                LOCK();
                local_1d0 = *local_658;
                *local_658 = *local_658 + -1;
                UNLOCK();
                if (local_1d0 == 1) {
                  if (local_640 == (long *)0x0) {
                    if (local_660 != (void *)0x0) {
                      free(local_660);
                    }
                  }
                  else {
                    (**(code **)(*local_640 + 0x18))(local_640,local_660);
                  }
                }
              }
              local_660 = (void *)0x0;
              local_650 = 0;
              local_648 = 0;
              local_638 = 0;
              local_634 = 0;
              local_630 = 0;
              local_62c = 0;
              local_628 = 0;
              local_620 = 0;
              local_658 = (int *)0x0;
              local_2b8 = (long *)(in_RDI + 0x290);
              bVar3 = true;
              if (*local_2b8 != 0) {
                bVar3 = *(long *)(in_RDI + 0x2d0) * (long)*(int *)(in_RDI + 0x2c8) == 0;
                local_10 = local_2b8;
              }
              if (bVar3) {
                local_444 = -100;
              }
              else {
                (**(code **)(*local_458 + 0x10))
                          (&local_6a8,local_458,*(undefined4 *)(in_RDI + 0xd0),1);
                ppvVar2 = (void **)(in_RDI + 0x2d8);
                local_3b8 = &local_6a8;
                local_3b0 = ppvVar2;
                if (ppvVar2 != local_3b8) {
                  if (local_6a0 != (int *)0x0) {
                    local_3bc = 1;
                    LOCK();
                    local_3c0 = *local_6a0;
                    *local_6a0 = *local_6a0 + 1;
                    UNLOCK();
                  }
                  local_208 = ppvVar2;
                  if (*(long *)(in_RDI + 0x2e0) != 0) {
                    piVar1 = *(int **)(in_RDI + 0x2e0);
                    local_20c = 0xffffffff;
                    LOCK();
                    local_210 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_210 == 1) {
                      if (*(long *)(in_RDI + 0x2f8) == 0) {
                        local_80 = *ppvVar2;
                        if (local_80 != (void *)0x0) {
                          free(local_80);
                        }
                      }
                      else {
                        (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x18))
                                  (*(long **)(in_RDI + 0x2f8),*ppvVar2);
                      }
                    }
                  }
                  *ppvVar2 = (void *)0x0;
                  *(undefined8 *)(in_RDI + 0x2e8) = 0;
                  *(undefined4 *)(in_RDI + 0x2f0) = 0;
                  *(undefined4 *)(in_RDI + 0x300) = 0;
                  *(undefined4 *)(in_RDI + 0x304) = 0;
                  *(undefined4 *)(in_RDI + 0x308) = 0;
                  *(undefined4 *)(in_RDI + 0x30c) = 0;
                  *(undefined4 *)(in_RDI + 0x310) = 0;
                  *(undefined8 *)(in_RDI + 0x318) = 0;
                  *(undefined8 *)(in_RDI + 0x2e0) = 0;
                  *ppvVar2 = *local_3b8;
                  *(void **)(in_RDI + 0x2e0) = local_3b8[1];
                  *(void **)(in_RDI + 0x2e8) = local_3b8[2];
                  *(undefined4 *)(in_RDI + 0x2f0) = *(undefined4 *)(local_3b8 + 3);
                  *(void **)(in_RDI + 0x2f8) = local_3b8[4];
                  *(undefined4 *)(in_RDI + 0x300) = *(undefined4 *)(local_3b8 + 5);
                  *(undefined4 *)(in_RDI + 0x304) = *(undefined4 *)((long)local_3b8 + 0x2c);
                  *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(local_3b8 + 6);
                  *(undefined4 *)(in_RDI + 0x30c) = *(undefined4 *)((long)local_3b8 + 0x34);
                  *(undefined4 *)(in_RDI + 0x310) = *(undefined4 *)(local_3b8 + 7);
                  *(void **)(in_RDI + 0x318) = local_3b8[8];
                }
                local_3d0 = &local_6a8;
                if (local_6a0 != (int *)0x0) {
                  local_1ec = 0xffffffff;
                  LOCK();
                  local_1f0 = *local_6a0;
                  *local_6a0 = *local_6a0 + -1;
                  UNLOCK();
                  if (local_1f0 == 1) {
                    local_3a8 = ppvVar2;
                    local_1e8 = local_3d0;
                    if (local_688 == (long *)0x0) {
                      if (local_6a8 != (void *)0x0) {
                        free(local_6a8);
                      }
                    }
                    else {
                      (**(code **)(*local_688 + 0x18))(local_688,local_6a8);
                    }
                  }
                }
                bVar3 = true;
                if (*(long *)(in_RDI + 0x2d8) != 0) {
                  bVar3 = *(long *)(in_RDI + 0x318) * (long)*(int *)(in_RDI + 0x310) == 0;
                }
                if (bVar3) {
                  local_444 = -100;
                }
                else {
                  local_444 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_444;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}